

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O2

Vector3 * __thiscall
stateObservation::kine::Orientation::differentiate
          (Vector3 *__return_storage_ptr__,Orientation *this,Orientation *R_k1)

{
  Orientation OStack_188;
  Orientation local_d8;
  
  check_(this);
  inverse(&OStack_188,this);
  Orientation(&local_d8,R_k1,&OStack_188);
  toRotationVector(__return_storage_ptr__,&local_d8);
  return __return_storage_ptr__;
}

Assistant:

inline Vector3 Orientation::differentiate(Orientation R_k1) const
{
  check_();
  return (Orientation(R_k1, inverse())).toRotationVector();
}